

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall ast::CallExpression::~CallExpression(CallExpression *this)

{
  pointer ppEVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppEVar4;
  
  (this->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR__CallExpression_00124768;
  if (this->function != (Expr *)0x0) {
    (*(this->function->super_Node)._vptr_Node[1])();
  }
  this->function = (Expr *)0x0;
  ppEVar4 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar4 != ppEVar1) {
    do {
      if (*ppEVar4 != (Expr *)0x0) {
        (*((*ppEVar4)->super_Node)._vptr_Node[1])();
      }
      ppEVar4 = ppEVar4 + 1;
    } while (ppEVar4 != ppEVar1);
    ppEVar4 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppEVar4) {
      (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppEVar4;
    }
  }
  if (ppEVar4 != (pointer)0x0) {
    operator_delete(ppEVar4,(long)(this->arguments).
                                  super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar4)
    ;
  }
  (this->tok)._vptr_Token = (_func_int **)&PTR__Token_001248c8;
  pcVar2 = (this->tok).Literal._M_dataplus._M_p;
  paVar3 = &(this->tok).Literal.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~CallExpression(){
        delete function;
        function = nullptr;
        for(auto arg: arguments){
           delete  arg;
           arg = nullptr;
        }
        arguments.clear();
    }